

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall mp::NLSolver::DestroyAutoStub(NLSolver *this)

{
  NLUtils *pNVar1;
  pointer pcVar2;
  error_code ec;
  path local_58;
  error_code local_30;
  
  if ((this->pathstr_)._M_string_length != 0) {
    local_30._M_value = 0;
    local_30._M_cat = (error_category *)std::_V2::system_category();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_58,&this->pathstr_,auto_format);
    std::filesystem::remove_all(&local_58,&local_30);
    std::filesystem::__cxx11::path::~path(&local_58);
    if (local_30._M_value != 0) {
      pNVar1 = this->p_ut_;
      pcVar2 = (this->pathstr_)._M_dataplus._M_p;
      (**(code **)(*(long *)local_30._M_cat + 0x20))(&local_58);
      (*pNVar1->_vptr_NLUtils[4])
                (pNVar1,"Failed to remove temp dir \'%s\': %s",pcVar2,
                 local_58._M_pathname._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
        operator_delete(local_58._M_pathname._M_dataplus._M_p,
                        local_58._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void NLSolver::DestroyAutoStub() {
  // delete temp folder if created
  if (pathstr_.size()) {
    std::error_code ec;
    std::filesystem::remove_all(pathstr_, ec);
    if (ec)
      Utils().log_warning("Failed to remove temp dir '%s': %s",
                          pathstr_.c_str(), ec.message().c_str());
  }
}